

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void __thiscall
minja::Value::Value(Value *this,
                   shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>_>
                   *callable)

{
  (this->array_).
  super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->array_).
  super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_enable_shared_from_this<minja::Value>)._M_weak_this.
  super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<minja::Value>)._M_weak_this.
  super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  make_shared<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,minja::Value,std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::allocator<std::pair<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const,minja::Value>>>>
            ();
  std::
  __shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&(this->callable_).
                  super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
                 ,&callable->
                   super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
                );
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json(&this->primitive_,(nullptr_t)0x0);
  return;
}

Assistant:

Value(const std::shared_ptr<CallableType> & callable) : object_(std::make_shared<ObjectType>()), callable_(callable) {}